

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
anon_func::Mapper::create(Mapper *this)

{
  Module *module;
  Map *map;
  _func_int **this_00;
  long in_RSI;
  _Any_data local_50;
  code *local_40;
  
  module = *(Module **)(in_RSI + 0x130);
  map = *(Map **)(in_RSI + 0x138);
  this_00 = (_func_int **)operator_new(0x160);
  std::function<void_(wasm::Function_*,_Info_&)>::function
            ((function<void_(wasm::Function_*,_Info_&)> *)&local_50,
             (function<void_(wasm::Function_*,_Info_&)>_conflict *)(in_RSI + 0x140));
  ::wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::SignaturePruning::
  iteration(wasm::Module*)::Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std
  ::function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::
  Module*)::Info&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm::
  (anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info,std::less<wasm::
  Function*>,std::allocator<std::pair<wasm::Function*const,wasm::(anonymous_namespace)::
  SignaturePruning::iteration(wasm::Module*)::Info>>>&,std::function<void(wasm::Function*,wasm::
  (anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info__>_
            (this_00,module,map,(Func *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  (this->super_WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>).super_Pass.
  _vptr_Pass = this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }